

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O2

vector<int,_std::allocator<int>_> *
read_rna(vector<int,_std::allocator<int>_> *__return_storage_ptr__,string *input)

{
  char cVar1;
  long *plVar2;
  ostream *poVar3;
  char byte;
  int local_24c;
  string line;
  ifstream fin;
  
  std::ifstream::ifstream(&fin,(string *)input,_S_in);
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  line.field_2._M_local_buf[0] = '\0';
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    while( true ) {
      plVar2 = (long *)std::istream::get((char *)&fin);
      if ((*(byte *)((long)plVar2 + *(long *)(*plVar2 + -0x18) + 0x20) & 5) != 0) break;
      if ((byte != '\n') && (byte != '\r')) {
        local_24c = to_int(byte);
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(__return_storage_ptr__,&local_24c)
        ;
      }
    }
    std::__cxx11::string::~string((string *)&line);
    std::ifstream::~ifstream(&fin);
    return __return_storage_ptr__;
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"Could not open the RNA file - \'");
  poVar3 = std::operator<<(poVar3,(string *)input);
  poVar3 = std::operator<<(poVar3,"\'");
  std::endl<char,std::char_traits<char>>(poVar3);
  exit(1);
}

Assistant:

vector<int> read_rna(string & input) {
    ifstream fin(input);
    vector<int> rna;
    string line;
    char byte;
    if (!fin.is_open()) {
        cout << "Could not open the RNA file - '" << input << "'" << endl;
        exit(1);
    }
    if (fin.is_open()) {

        while (fin.get(byte)) {
            if (byte != '\n' && byte != '\r') {
                rna.push_back(to_int(byte));
            }
        }
    }
    return rna;
}